

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

void XUtf8DrawRtlString(Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int x,int y,
                       char *string,int num_bytes)

{
  XFontStruct **ppXVar1;
  int *piVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  uint local_178;
  uint no_spc;
  uint ucs;
  int ulen;
  int *ranges;
  int iStack_160;
  char glyph [2];
  int nb_font;
  int last_fnum;
  int first;
  int i;
  int fnum;
  XChar2b *ptr;
  XChar2b buf [128];
  XFontStruct **fonts;
  int *encodings;
  int y_local;
  int x_local;
  GC gc_local;
  XUtf8FontStruct *font_set_local;
  Drawable d_local;
  Display *display_local;
  
  ranges._4_4_ = font_set->nb_font;
  if (0 < ranges._4_4_) {
    _ucs = font_set->ranges;
    ppXVar1 = font_set->fonts;
    piVar2 = font_set->encodings;
    last_fnum = 0;
    first = 0;
    _i = buf + 0x7c;
    while( true ) {
      iVar6 = first;
      bVar7 = false;
      if (first < ranges._4_4_) {
        bVar7 = ppXVar1[first] == (XFontStruct *)0x0;
      }
      if (!bVar7) break;
      first = first + 1;
    }
    encodings._4_4_ = x;
    if (first < ranges._4_4_) {
      for (; iStack_160 = first, 0 < num_bytes; num_bytes = num_bytes - no_spc) {
        if (0x78 < last_fnum) {
          XSetFont(display,gc,ppXVar1[first]->fid);
          iVar4 = XTextWidth16(ppXVar1[first],_i,last_fnum);
          encodings._4_4_ = encodings._4_4_ - iVar4;
          XDrawString16(display,d,gc,encodings._4_4_,y,_i,last_fnum);
          last_fnum = 0;
          _i = buf + 0x7c;
        }
        no_spc = XFastConvertUtf8ToUcs((uchar *)string,num_bytes,&local_178);
        if ((int)no_spc < 1) {
          no_spc = 1;
        }
        uVar3 = XUtf8IsNonSpacing(local_178);
        uVar5 = (uint)uVar3;
        first = iVar6;
        if (uVar5 != 0) {
          local_178 = uVar5;
        }
        while ((first < ranges._4_4_ &&
               (((ppXVar1[first] == (XFontStruct *)0x0 ||
                 (iVar4 = ucs2fontmap((char *)((long)&ranges + 2),local_178,piVar2[first]),
                 iVar4 < 0)) ||
                ((piVar2[first] == 0 &&
                 (((int)local_178 < _ucs[first << 1] || (_ucs[first * 2 + 1] < (int)local_178)))))))
               )) {
          first = first + 1;
        }
        if (first == ranges._4_4_) {
          ucs2fontmap((char *)((long)&ranges + 2),0x3f,piVar2[iVar6]);
          first = iVar6;
        }
        if ((iStack_160 == first) && (uVar5 == 0)) {
          _i[-1].byte1 = ranges._2_1_;
          _i[-1].byte2 = ranges._3_1_;
          _i = _i + -1;
        }
        else {
          XSetFont(display,gc,ppXVar1[iStack_160]->fid);
          iVar4 = XTextWidth16(ppXVar1[iStack_160],_i,last_fnum);
          encodings._4_4_ = encodings._4_4_ - iVar4;
          XDrawString16(display,d,gc,encodings._4_4_,y,_i,last_fnum);
          last_fnum = 0;
          _i = buf + 0x7b;
          buf[0x7b].byte1 = ranges._2_1_;
          buf[0x7b].byte2 = ranges._3_1_;
          if (uVar5 != 0) {
            iVar4 = XTextWidth16(ppXVar1[first],_i,1);
            encodings._4_4_ = iVar4 + encodings._4_4_;
          }
        }
        last_fnum = last_fnum + 1;
        string = string + (int)no_spc;
      }
      if (0 < last_fnum) {
        XSetFont(display,gc,ppXVar1[first]->fid);
        iVar6 = XTextWidth16(ppXVar1[iStack_160],_i,last_fnum);
        XDrawString16(display,d,gc,encodings._4_4_ - iVar6,y,_i,last_fnum);
      }
    }
  }
  return;
}

Assistant:

void
XUtf8DrawRtlString(Display 		*display,
		   Drawable 		d,
		   XUtf8FontStruct 	*font_set,
		   GC 			gc,
		   int 			x,
		   int 			y,
		   const char		*string,
		   int 			num_bytes) {

  int 		*encodings;	/* encodings array */
  XFontStruct 	**fonts;	/* fonts array */
  Fl_XChar2b 	buf[128];	/* drawing buffer */
  Fl_XChar2b	*ptr;		/* pointer to the drawing buffer */
  int 		fnum;		/* index of the current font in the fonts array*/
  int 		i;		/* current byte in the XChar2b buffer */
  int 		first;		/* first valid font index */
  int 		last_fnum;	/* font index of the previous char */
  int 		nb_font;	/* quantity of fonts in the font array */
  char 		glyph[2];	/* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;	/* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;
  ptr = buf + 128;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      x -= XTextWidth16(fonts[fnum], ptr, i);
      XDrawString16(display, d, gc, x, y, ptr, i);
      i = 0;
      ptr = buf + 128;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] && (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      x -= XTextWidth16(fonts[last_fnum], ptr, i);
      XDrawString16(display, d, gc, x, y, ptr, i);
      i = 0;
      ptr = buf + 127;
      (*ptr).byte1 = glyph[0];
      (*ptr).byte2 = glyph[1];
      if (no_spc) {
	x += XTextWidth16(fonts[fnum], ptr, 1);
      }
    } else {
      ptr--;
      (*ptr).byte1 = glyph[0];
      (*ptr).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  if (i < 1) return;

  XSetFont(display, gc, fonts[fnum]->fid);
  x -= XTextWidth16(fonts[last_fnum], ptr, i);
  XDrawString16(display, d, gc, x, y, ptr, i);
}